

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O1

void Cba_NtkPrintNodes(Cba_Ntk_t *p,int Type)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  char *pTypeNames [90];
  char *local_308 [91];
  
  Cba_ManCreatePrimMap(local_308);
  printf("Operation %s\n",local_308[Type]);
  if (1 < (p->vObjType).nSize) {
    uVar10 = 0;
    lVar11 = 0;
    do {
      lVar1 = lVar11 + 1;
      if ((p->vObjType).nSize <= lVar1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if ((p->vObjType).pArray[lVar11 + 1] != '\0') {
        if ((p->vObjFin0).nSize <= lVar1) goto LAB_0033358d;
        iVar2 = (p->vObjFin0).pArray[lVar11 + 1];
        if ((long)iVar2 < 1) {
LAB_003335ac:
          __assert_fail("f>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                        ,0x169,"int Cba_FinFon(Cba_Ntk_t *, int)");
        }
        iVar5 = (p->vFinFon).nSize;
        if ((iVar5 <= iVar2) || (iVar5 <= (int)(iVar2 + 1U))) goto LAB_0033358d;
        piVar3 = (p->vFinFon).pArray;
        uVar8 = piVar3[iVar2];
        uVar9 = piVar3[iVar2 + 1U];
        printf("%8d  :",(ulong)uVar10);
        iVar2 = (int)lVar11;
        printf("%8d  :  ",(ulong)(iVar2 + 1));
        if ((p->vObjFon0).nSize <= lVar1) goto LAB_0033358d;
        uVar4 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[lVar11 + 1]);
        iVar5 = Cba_ObjSigned(p,iVar2 + 1);
        pcVar7 = "s";
        if (iVar5 == 0) {
          pcVar7 = " ";
        }
        printf("%3d%s = ",(ulong)uVar4,pcVar7);
        if ((p->vObjFin0).nSize <= lVar1) goto LAB_0033358d;
        iVar5 = (p->vObjFin0).pArray[lVar11 + 1];
        if ((long)iVar5 < 1) goto LAB_003335ac;
        if ((p->vFinFon).nSize <= iVar5) goto LAB_0033358d;
        iVar5 = (p->vFinFon).pArray[iVar5];
        if ((long)iVar5 < 1) {
LAB_003335cb:
          __assert_fail("i>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                        ,0x155,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
        }
        if ((p->vObjFon0).nSize <= iVar5) goto LAB_0033358d;
        uVar4 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar5]);
        iVar5 = Cba_ObjSigned(p,uVar8);
        pcVar7 = "s";
        if (iVar5 == 0) {
          pcVar7 = " ";
        }
        printf("%3d%s  %s ",(ulong)uVar4,pcVar7,local_308[Type]);
        if ((p->vObjFin0).nSize <= lVar1) goto LAB_0033358d;
        iVar5 = (p->vObjFin0).pArray[lVar11 + 1];
        if (iVar5 < 0) goto LAB_003335ac;
        uVar4 = iVar5 + 1;
        if ((p->vFinFon).nSize <= (int)uVar4) goto LAB_0033358d;
        iVar5 = (p->vFinFon).pArray[uVar4];
        if ((long)iVar5 < 1) goto LAB_003335cb;
        if ((p->vObjFon0).nSize <= iVar5) goto LAB_0033358d;
        uVar4 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar5]);
        iVar5 = Cba_ObjSigned(p,uVar9);
        pcVar7 = "s";
        if (iVar5 == 0) {
          pcVar7 = " ";
        }
        printf("%3d%s ",(ulong)uVar4,pcVar7);
        printf(" :    ");
        if ((p->vObjName).nSize < 1) {
          __assert_fail("Cba_NtkHasObjNames(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                        ,0x15d,"int Cba_ObjName(Cba_Ntk_t *, int)");
        }
        Vec_IntFillExtra(&p->vObjName,iVar2 + 2,0);
        if ((p->vObjName).nSize <= lVar1) goto LAB_0033358d;
        pcVar7 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[lVar11 + 1]);
        printf("%-12s =  ",pcVar7);
        if (-1 < (int)uVar8) {
          if (0 < (p->vFonName).nSize) {
            if ((ulong)uVar8 != 0) {
              Vec_IntFillExtra(&p->vFonName,uVar8 + 1,0);
              if ((p->vFonName).nSize <= (int)uVar8) goto LAB_0033358d;
              uVar8 = (p->vFonName).pArray[uVar8];
              lVar6 = 0x10;
              goto LAB_003334c3;
            }
LAB_00333609:
            pcVar7 = "Cba_FonIsReal(f)";
            goto LAB_00333619;
          }
LAB_00333612:
          pcVar7 = "Cba_NtkHasFonNames(p)";
LAB_00333619:
          __assert_fail(pcVar7,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                        ,0x18b,"char *Cba_FonNameStr(Cba_Ntk_t *, int)");
        }
        uVar8 = ~uVar8;
        lVar6 = 0x18;
LAB_003334c3:
        pcVar7 = Abc_NamStr(*(Abc_Nam_t **)((long)p->pDesign->pTypeNames + lVar6 + -0x70),uVar8);
        printf("%-12s  %s  ",pcVar7,local_308[Type]);
        if ((int)uVar9 < 0) {
          uVar9 = ~uVar9;
          lVar6 = 0x18;
        }
        else {
          if ((p->vFonName).nSize < 1) goto LAB_00333612;
          if ((ulong)uVar9 == 0) goto LAB_00333609;
          Vec_IntFillExtra(&p->vFonName,uVar9 + 1,0);
          if ((p->vFonName).nSize <= (int)uVar9) {
LAB_0033358d:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar9 = (p->vFonName).pArray[uVar9];
          lVar6 = 0x10;
        }
        uVar10 = uVar10 + 1;
        pcVar7 = Abc_NamStr(*(Abc_Nam_t **)((long)p->pDesign->pTypeNames + lVar6 + -0x70),uVar9);
        printf("%-12s ",pcVar7);
        putchar(10);
      }
      lVar6 = lVar11 + 2;
      lVar11 = lVar1;
    } while (lVar6 < (p->vObjType).nSize);
  }
  return;
}

Assistant:

void Cba_NtkPrintNodes( Cba_Ntk_t * p, int Type )
{
    int i, iFon0, iFon1, Counter = 0;
    char * pTypeNames[CBA_BOX_LAST];
    Cba_ManCreatePrimMap( pTypeNames );
    printf( "Operation %s\n", pTypeNames[Type] );
    Cba_NtkForEachObj( p, i )
    {
        if ( (int)Type != Type )
            continue;
        iFon0 = Cba_ObjFinFon(p, i, 0);
        iFon1 = Cba_ObjFinFon(p, i, 1);

        printf( "%8d  :",      Counter++ );
        printf( "%8d  :  ",    i );
        printf( "%3d%s = ",    Cba_ObjRangeSize(p, i),                      Cba_ObjSigned(p, i) ? "s" : " " );
        printf( "%3d%s  %s ",  Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)), Cba_ObjSigned(p, iFon0) ? "s" : " ", pTypeNames[Type] );
        printf( "%3d%s ",      Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 1)), Cba_ObjSigned(p, iFon1) ? "s" : " " );
        printf( " :    " );
        printf( "%-12s =  ",   Cba_ObjNameStr(p, i) );
        printf( "%-12s  %s  ", Cba_FonIsConst(iFon0) ? Cba_NtkConst(p, Cba_FonConst(iFon0)) : Cba_FonNameStr(p, iFon0), pTypeNames[Type] );
        printf( "%-12s ",      Cba_FonIsConst(iFon1) ? Cba_NtkConst(p, Cba_FonConst(iFon1)) : Cba_FonNameStr(p, iFon1) );
        printf( "\n" );
    }
}